

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# H19_binary_search.c
# Opt level: O0

int func(int *data,int head,int tail,int key)

{
  int center;
  int key_local;
  int tail_local;
  int head_local;
  int *data_local;
  
  data_local._4_4_ = (head + tail) / 2;
  if (tail < head) {
    data_local._4_4_ = -1;
  }
  else if (data[data_local._4_4_] != key) {
    if (key < data[data_local._4_4_]) {
      data_local._4_4_ = func(data,head,data_local._4_4_ + -1,key);
    }
    else {
      data_local._4_4_ = func(data,data_local._4_4_ + 1,tail,key);
    }
  }
  return data_local._4_4_;
}

Assistant:

int func(int data[], int head, int tail, int key) {
  int center = (head + tail) / 2;

  if (head > tail) {
    return -1;
  }

  else if (data[center] == key) {
    return center;
  }

  else if (data[center] > key) {
    return func(data, head, center - 1, key);
  }

  else {
    return func(data, center + 1, tail, key);
  }
}